

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  LogMessage *other;
  Type *pTVar1;
  int iVar2;
  Type *result;
  byte local_49;
  LogMessage local_48;
  RepeatedPtrFieldBase *local_10;
  RepeatedPtrFieldBase *this_local;
  
  local_49 = 0;
  local_10 = this;
  if (this->current_size_ < 1) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x714);
    local_49 = 1;
    other = LogMessage::operator<<(&local_48,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=((LogFinisher *)((long)&result + 3),other);
  }
  if ((local_49 & 1) != 0) {
    LogMessage::~LogMessage(&local_48);
  }
  iVar2 = this->current_size_ + -1;
  this->current_size_ = iVar2;
  pTVar1 = cast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                     (this->rep_->elements[iVar2]);
  this->rep_->allocated_size = this->rep_->allocated_size + -1;
  if (this->current_size_ < this->rep_->allocated_size) {
    this->rep_->elements[this->current_size_] = this->rep_->elements[this->rep_->allocated_size];
  }
  return pTVar1;
}

Assistant:

inline typename TypeHandler::Type*
  RepeatedPtrFieldBase::UnsafeArenaReleaseLast() {
  GOOGLE_DCHECK_GT(current_size_, 0);
  typename TypeHandler::Type* result =
      cast<TypeHandler>(rep_->elements[--current_size_]);
  --rep_->allocated_size;
  if (current_size_ < rep_->allocated_size) {
    // There are cleared elements on the end; replace the removed element
    // with the last allocated element.
    rep_->elements[current_size_] = rep_->elements[rep_->allocated_size];
  }
  return result;
}